

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::RangeTokenMap::setRangeToken
          (RangeTokenMap *this,XMLCh *keyword,RangeToken *tok,bool complement)

{
  bool bVar1;
  RangeTokenElemMap *pRVar2;
  RuntimeException *this_00;
  
  bVar1 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::containsKey
                    (this->fTokenRegistry,keyword);
  if (bVar1) {
    pRVar2 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::get
                       (this->fTokenRegistry,keyword);
    (&pRVar2->fRange)[complement] = tok;
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RangeTokenMap.cpp"
             ,0xce,Regex_KeywordNotFound,keyword,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
             this->fTokenRegistry->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void RangeTokenMap::setRangeToken(const XMLCh* const keyword,
                                  RangeToken* const tok,const bool complement) {

    if (fTokenRegistry->containsKey(keyword)) {
        fTokenRegistry->get(keyword)->setRangeToken(tok, complement);
    }
    else {
        ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Regex_KeywordNotFound, keyword, fTokenRegistry->getMemoryManager());
    }
}